

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

QRegion __thiscall
QGraphicsViewPrivate::mapToViewRegion(QGraphicsViewPrivate *this,QGraphicsItem *item,QRectF *rect)

{
  QTransform *in_RDX;
  QGraphicsViewPrivate *in_RSI;
  QRegionData *in_RDI;
  long in_FS_OFFSET;
  QGraphicsView *q;
  QTransform itv;
  QGraphicsViewPrivate *in_stack_fffffffffffffec0;
  QGraphicsView *in_stack_fffffffffffffed8;
  QRegion *this_00;
  QGraphicsViewPrivate *this_01;
  QRegionData *itemToDeviceTransform;
  QGraphicsItem *in_stack_ffffffffffffff20;
  QRegion local_b0 [11];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RSI;
  itemToDeviceTransform = in_RDI;
  q_func(in_RSI);
  if ((*(uint *)&in_RSI->field_0x300 >> 5 & 1) != 0) {
    updateScroll(in_stack_fffffffffffffec0);
  }
  local_18 = 0xffffffffffffffff;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = 0xffffffffffffffff;
  uStack_20 = 0xffffffffffffffff;
  local_38 = 0xffffffffffffffff;
  uStack_30 = 0xffffffffffffffff;
  local_48 = 0xffffffffffffffff;
  uStack_40 = 0xffffffffffffffff;
  local_58 = 0xffffffffffffffff;
  uStack_50 = 0xffffffffffffffff;
  QGraphicsView::viewportTransform(in_stack_fffffffffffffed8);
  QGraphicsItem::deviceTransform((QGraphicsItem *)this_01,in_RDX);
  this_00 = local_b0;
  QGraphicsItem::boundingRegion(in_stack_ffffffffffffff20,(QTransform *)itemToDeviceTransform);
  QTransform::mapRect((QRectF *)&stack0xffffffffffffff20);
  QRectF::toAlignedRect();
  QRegion::operator&((QRegion *)in_RDI,(QRect *)this_00);
  QRegion::~QRegion(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QRegion)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QRegion QGraphicsViewPrivate::mapToViewRegion(const QGraphicsItem *item, const QRectF &rect) const
{
    Q_Q(const QGraphicsView);
    if (dirtyScroll)
        const_cast<QGraphicsViewPrivate *>(this)->updateScroll();

    // Accurate bounding region
    QTransform itv = item->deviceTransform(q->viewportTransform());
    return item->boundingRegion(itv) & itv.mapRect(rect).toAlignedRect();
}